

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntBounds.cpp
# Opt level: O2

bool __thiscall IntBounds::IsGreaterThanOrEqualTo(IntBounds *this,Value *value,int offset)

{
  ValueInfo *this_00;
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  ValueNumber local_44;
  ValueRelativeOffset *local_40;
  ValueRelativeOffset *bound;
  int constantBoundBase;
  
  if (value == (Value *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IntBounds.cpp"
                       ,0x156,"(value)","value");
    if (!bVar2) goto LAB_005146d5;
    *puVar5 = 0;
  }
  this_00 = value->valueInfo;
  bound._4_4_ = 0x7fffffff;
  bVar2 = ValueInfo::TryGetIntConstantUpperBound(this_00,(int32 *)((long)&bound + 4),true);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IntBounds.cpp"
                       ,0x15b,"(success)","success");
    if (!bVar2) {
LAB_005146d5:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  bVar3 = IsGreaterThanOrEqualTo(this,bound._4_4_,offset);
  bVar2 = true;
  if (!bVar3) {
    bVar2 = false;
    bVar3 = ValueInfo::HasIntConstantValue(this_00,false);
    if (!bVar3) {
      local_44 = value->valueNumber;
      bVar2 = JsUtil::
              BaseDictionary<unsigned_int,_ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
              ::TryGetReference<unsigned_int>
                        (&(this->relativeLowerBounds).
                          super_BaseDictionary<unsigned_int,_ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                         ,&local_44,&local_40);
      if (bVar2) {
        iVar4 = ValueRelativeOffset::Offset(local_40);
        bVar2 = offset <= iVar4;
      }
      else {
        bVar2 = false;
      }
    }
  }
  return bVar2;
}

Assistant:

bool IntBounds::IsGreaterThanOrEqualTo(const Value *const value, const int offset) const
{
    Assert(value);

    ValueInfo const * const valueInfo = value->GetValueInfo();
    int constantBoundBase = INT32_MAX;
    const bool success = valueInfo->TryGetIntConstantUpperBound(&constantBoundBase, true);
    Assert(success);
    if(IsGreaterThanOrEqualTo(constantBoundBase, offset))
        return true;

    if(valueInfo->HasIntConstantValue())
        return false;

    const ValueRelativeOffset *bound;
    return relativeLowerBounds.TryGetReference(value->GetValueNumber(), &bound) && bound->Offset() >= offset;
}